

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType0.cpp
# Opt level: O3

KBOOL __thiscall
KDIS::DATA_TYPE::GridDataType0::operator==(GridDataType0 *this,GridDataType0 *Value)

{
  pointer __s1;
  pointer puVar1;
  pointer __s2;
  KBOOL KVar2;
  int iVar3;
  size_t __n;
  
  KVar2 = GridData::operator!=(&this->super_GridData,&Value->super_GridData);
  if ((!KVar2) &&
     (*(short *)&(this->super_GridData).field_0xc == *(short *)&(Value->super_GridData).field_0xc))
  {
    __s1 = (this->m_vui8DataVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
    puVar1 = (this->m_vui8DataVals).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    __n = (long)puVar1 - (long)__s1;
    __s2 = (Value->m_vui8DataVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
           ._M_impl.super__Vector_impl_data._M_start;
    if (__n == (long)(Value->m_vui8DataVals).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)__s2) {
      if (puVar1 == __s1) {
        return true;
      }
      iVar3 = bcmp(__s1,__s2,__n);
      if (iVar3 == 0) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

KBOOL GridDataType0::operator == ( const GridDataType0 & Value ) const
{
    if( GridData::operator != ( Value ) )         return false;
    if( m_ui16NumBytes != Value.m_ui16NumBytes )  return false;
    if( m_vui8DataVals  != Value.m_vui8DataVals ) return false;
    return true;
}